

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNdr.c
# Opt level: O3

void Wln_NtkToNdrTest(Wln_Ntk_t *p)

{
  byte bVar1;
  void *__ptr;
  bool bVar2;
  Ndr_Data_t *p_00;
  void *__ptr_00;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  uchar *puVar6;
  uint *puVar7;
  uint *puVar8;
  FILE *pFVar9;
  int Obj;
  int iVar10;
  byte bVar11;
  uint uVar12;
  int iVar13;
  undefined8 uVar14;
  long lVar15;
  int Ent;
  int iVar16;
  int iVar17;
  uint *puVar18;
  undefined8 uVar19;
  uint uVar20;
  int Ent_1;
  int iVar21;
  uint uVar22;
  int Ent_2;
  int iVar23;
  ulong uVar24;
  Ndr_Data_t *p_1;
  uint *local_70;
  void *local_60;
  
  p_00 = (Ndr_Data_t *)Wln_NtkToNdr(p);
  lVar15 = (long)(p->vTypes).nSize;
  __ptr_00 = malloc(lVar15 * 8 + 8);
  if (1 < lVar15) {
    lVar15 = 1;
    do {
      pcVar3 = Wln_ObjName(p,(int)lVar15);
      if (pcVar3 == (char *)0x0) {
        pcVar5 = (char *)0x0;
      }
      else {
        sVar4 = strlen(pcVar3);
        pcVar5 = (char *)malloc(sVar4 + 1);
        strcpy(pcVar5,pcVar3);
      }
      *(char **)((long)__ptr_00 + lVar15 * 8) = pcVar5;
      lVar15 = lVar15 + 1;
    } while (lVar15 < (p->vTypes).nSize);
  }
  pFVar9 = _stdout;
  if (_stdout == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",0);
  }
  else {
    puVar8 = p_00->pBody;
    if (1 < (int)*puVar8) {
      puVar6 = p_00->pHead;
      iVar13 = 1;
      do {
        bVar11 = puVar6[iVar13];
        if (bVar11 == 2) {
          Obj = iVar13 + 1;
          iVar21 = puVar8[iVar13] + iVar13;
          if (Obj < iVar21) {
            iVar23 = 0;
            iVar10 = Obj;
            do {
              bVar11 = puVar6[iVar10];
              if (bVar11 == 3) {
                for (iVar16 = iVar10 + 1; iVar16 < (int)(puVar8[iVar10] + iVar10);
                    iVar16 = iVar16 + uVar12) {
                  bVar1 = puVar6[iVar16];
                  if (bVar1 == 6) {
                    iVar23 = iVar23 + (uint)(puVar8[iVar16] == 4);
                    goto LAB_00380f7d;
                  }
                  if (bVar1 == 0) goto LAB_003829f4;
                  uVar12 = 1;
                  if (bVar1 < 4) {
                    uVar12 = puVar8[iVar16];
                  }
                }
                iVar23 = iVar23 + 1;
              }
              else if (bVar11 == 0) goto LAB_003829f4;
LAB_00380f7d:
              uVar12 = 1;
              if (bVar11 < 4) {
                uVar12 = puVar8[iVar10];
              }
              iVar10 = iVar10 + uVar12;
            } while (iVar10 < iVar21);
            local_60 = malloc((long)iVar23 << 2);
            iVar10 = Obj;
            do {
              bVar11 = puVar6[iVar10];
              if (bVar11 == 7) {
                lVar15 = (long)(int)puVar8[iVar10];
                goto LAB_00380fed;
              }
              if (bVar11 == 0) goto LAB_003829f4;
              uVar12 = 1;
              if (bVar11 < 4) {
                uVar12 = puVar8[iVar10];
              }
              iVar10 = iVar10 + uVar12;
            } while (iVar10 < iVar21);
          }
          else {
            local_60 = malloc(0);
          }
          lVar15 = -1;
LAB_00380fed:
          fprintf(pFVar9,"\nmodule %s (\n  ",*(undefined8 *)((long)__ptr_00 + lVar15 * 8));
          puVar8 = p_00->pBody;
          if (Obj < (int)(puVar8[iVar13] + iVar13)) {
            puVar6 = p_00->pHead;
            iVar21 = Obj;
            do {
              bVar11 = puVar6[iVar21];
              if (bVar11 == 3) {
                iVar23 = iVar21 + 1;
                uVar12 = puVar8[iVar21];
                iVar16 = uVar12 + iVar21;
                lVar15 = -1;
                iVar10 = iVar23;
                if (iVar23 < iVar16) {
                  do {
                    bVar11 = puVar6[iVar10];
                    if (bVar11 == 6) {
                      if (puVar8[iVar10] != 3) goto LAB_003810fd;
                      break;
                    }
                    if (bVar11 == 0) goto LAB_003829f4;
                    uVar22 = 1;
                    if (bVar11 < 4) {
                      uVar22 = puVar8[iVar10];
                    }
                    iVar10 = iVar10 + uVar22;
                  } while (iVar10 < iVar16);
                  do {
                    bVar11 = puVar6[iVar23];
                    if (bVar11 == 5) {
                      lVar15 = (long)(int)puVar8[iVar23];
                      break;
                    }
                    if (bVar11 == 0) goto LAB_003829f4;
                    uVar12 = 1;
                    if (bVar11 < 4) {
                      uVar12 = puVar8[iVar23];
                    }
                    iVar23 = iVar23 + uVar12;
                  } while (iVar23 < iVar16);
                }
                fprintf(pFVar9,"%s, ",*(undefined8 *)((long)__ptr_00 + lVar15 * 8));
                puVar6 = p_00->pHead;
                bVar11 = puVar6[iVar21];
              }
              else if (bVar11 == 0) goto LAB_003829f4;
              if (bVar11 == 0) goto LAB_003829f4;
              puVar8 = p_00->pBody;
              uVar12 = 1;
              if (bVar11 < 4) {
                uVar12 = puVar8[iVar21];
              }
LAB_003810fd:
              iVar21 = iVar21 + uVar12;
            } while (iVar21 < (int)(puVar8[iVar13] + iVar13));
          }
          fwrite("\n  ",3,1,pFVar9);
          puVar8 = p_00->pBody;
          if (Obj < (int)(puVar8[iVar13] + iVar13)) {
            puVar6 = p_00->pHead;
            bVar2 = true;
            iVar21 = Obj;
            do {
              bVar11 = puVar6[iVar21];
              if (bVar11 == 3) {
                iVar23 = iVar21 + 1;
                uVar12 = puVar8[iVar21];
                iVar16 = uVar12 + iVar21;
                iVar10 = iVar23;
                if (iVar23 < iVar16) {
                  do {
                    bVar11 = puVar6[iVar10];
                    if (bVar11 == 6) {
                      if (puVar8[iVar10] != 4) goto LAB_00381256;
                      break;
                    }
                    if (bVar11 == 0) goto LAB_003829f4;
                    uVar22 = 1;
                    if (bVar11 < 4) {
                      uVar22 = puVar8[iVar10];
                    }
                    iVar10 = iVar10 + uVar22;
                  } while (iVar10 < iVar16);
                  pcVar3 = "";
                  if (!bVar2) {
                    pcVar3 = ", ";
                  }
                  do {
                    bVar11 = puVar6[iVar23];
                    if (bVar11 == 4) {
                      lVar15 = (long)(int)puVar8[iVar23];
                      goto LAB_00381216;
                    }
                    if (bVar11 == 0) goto LAB_003829f4;
                    uVar12 = 1;
                    if (bVar11 < 4) {
                      uVar12 = puVar8[iVar23];
                    }
                    iVar23 = iVar23 + uVar12;
                  } while (iVar23 < iVar16);
                }
                else {
                  pcVar3 = "";
                  if (!bVar2) {
                    pcVar3 = ", ";
                  }
                }
                lVar15 = -1;
LAB_00381216:
                bVar2 = false;
                fprintf(pFVar9,"%s%s",pcVar3,*(undefined8 *)((long)__ptr_00 + lVar15 * 8));
                puVar6 = p_00->pHead;
                bVar11 = puVar6[iVar21];
              }
              else if (bVar11 == 0) goto LAB_003829f4;
              if (bVar11 == 0) goto LAB_003829f4;
              puVar8 = p_00->pBody;
              uVar12 = 1;
              if (bVar11 < 4) {
                uVar12 = puVar8[iVar21];
              }
LAB_00381256:
              iVar21 = iVar21 + uVar12;
            } while (iVar21 < (int)(puVar8[iVar13] + iVar13));
          }
          fwrite("\n);\n\n",5,1,pFVar9);
          puVar8 = p_00->pBody;
          iVar21 = puVar8[iVar13] + iVar13;
          if (Obj < iVar21) {
            puVar6 = p_00->pHead;
            iVar10 = Obj;
            do {
              bVar11 = puVar6[iVar10];
              if (bVar11 == 3) {
                uVar12 = puVar8[iVar10];
                iVar23 = iVar10 + 1;
                for (iVar21 = iVar23; iVar21 < (int)(uVar12 + iVar10); iVar21 = iVar21 + uVar22) {
                  bVar11 = puVar6[iVar21];
                  if (bVar11 == 6) {
                    if (puVar8[iVar21] != 3) goto LAB_003813b5;
                    break;
                  }
                  if (bVar11 == 0) goto LAB_003829f4;
                  uVar22 = 1;
                  if (bVar11 < 4) {
                    uVar22 = puVar8[iVar21];
                  }
                }
                fwrite("  input ",8,1,pFVar9);
                Ndr_ObjWriteRange(p_00,iVar10,(FILE *)pFVar9,1);
                puVar8 = p_00->pBody;
                lVar15 = -1;
                if (iVar23 < (int)(puVar8[iVar10] + iVar10)) {
                  do {
                    bVar11 = p_00->pHead[iVar23];
                    if (bVar11 == 5) {
                      lVar15 = (long)(int)puVar8[iVar23];
                      break;
                    }
                    if (bVar11 == 0) goto LAB_003829f4;
                    uVar12 = 1;
                    if (bVar11 < 4) {
                      uVar12 = puVar8[iVar23];
                    }
                    iVar23 = iVar23 + uVar12;
                  } while (iVar23 < (int)(puVar8[iVar10] + iVar10));
                }
                fprintf(pFVar9," %s;\n",*(undefined8 *)((long)__ptr_00 + lVar15 * 8));
                puVar6 = p_00->pHead;
                bVar11 = puVar6[iVar10];
              }
              else if (bVar11 == 0) goto LAB_003829f4;
              if (bVar11 == 0) goto LAB_003829f4;
              puVar8 = p_00->pBody;
              uVar12 = 1;
              if (bVar11 < 4) {
                uVar12 = puVar8[iVar10];
              }
LAB_003813b5:
              iVar10 = iVar10 + uVar12;
              iVar21 = puVar8[iVar13] + iVar13;
            } while (iVar10 < iVar21);
          }
          uVar12 = 0;
          if (Obj < iVar21) {
            puVar6 = p_00->pHead;
            uVar12 = 0;
            iVar21 = Obj;
            do {
              bVar11 = puVar6[iVar21];
              if (bVar11 == 3) {
                uVar22 = puVar8[iVar21];
                iVar23 = iVar21 + 1;
                for (iVar10 = iVar23; iVar10 < (int)(uVar22 + iVar21); iVar10 = iVar10 + uVar20) {
                  bVar11 = puVar6[iVar10];
                  if (bVar11 == 6) {
                    if (puVar8[iVar10] != 4) goto LAB_0038155a;
                    break;
                  }
                  if (bVar11 == 0) goto LAB_003829f4;
                  uVar20 = 1;
                  if (bVar11 < 4) {
                    uVar20 = puVar8[iVar10];
                  }
                }
                fwrite("  output ",9,1,pFVar9);
                Ndr_ObjWriteRange(p_00,iVar21,(FILE *)pFVar9,1);
                puVar8 = p_00->pBody;
                lVar15 = -1;
                if (iVar23 < (int)(puVar8[iVar21] + iVar21)) {
                  iVar10 = iVar23;
                  do {
                    bVar11 = p_00->pHead[iVar10];
                    if (bVar11 == 4) {
                      lVar15 = (long)(int)puVar8[iVar10];
                      break;
                    }
                    if (bVar11 == 0) goto LAB_003829f4;
                    uVar22 = 1;
                    if (bVar11 < 4) {
                      uVar22 = puVar8[iVar10];
                    }
                    iVar10 = iVar10 + uVar22;
                  } while (iVar10 < (int)(puVar8[iVar21] + iVar21));
                }
                fprintf(pFVar9," %s;\n",*(undefined8 *)((long)__ptr_00 + lVar15 * 8));
                puVar6 = p_00->pHead;
                puVar8 = p_00->pBody;
                uVar22 = 0xffffffff;
                for (; iVar23 < (int)(puVar8[iVar21] + iVar21); iVar23 = iVar23 + uVar20) {
                  bVar11 = puVar6[iVar23];
                  if (bVar11 == 4) {
                    uVar22 = puVar8[iVar23];
                    break;
                  }
                  if (bVar11 == 0) goto LAB_003829f4;
                  uVar20 = 1;
                  if (bVar11 < 4) {
                    uVar20 = puVar8[iVar23];
                  }
                }
                lVar15 = (long)(int)uVar12;
                uVar12 = uVar12 + 1;
                *(uint *)((long)local_60 + lVar15 * 4) = uVar22;
                bVar11 = puVar6[iVar21];
              }
              else if (bVar11 == 0) goto LAB_003829f4;
              if (bVar11 == 0) goto LAB_003829f4;
              uVar22 = 1;
              if (bVar11 < 4) {
                uVar22 = puVar8[iVar21];
              }
LAB_0038155a:
              iVar21 = iVar21 + uVar22;
            } while (iVar21 < (int)(puVar8[iVar13] + iVar13));
          }
          fputc(10,pFVar9);
          puVar8 = p_00->pBody;
          if (Obj < (int)(puVar8[iVar13] + iVar13)) {
            puVar6 = p_00->pHead;
            iVar21 = Obj;
LAB_003815a2:
            bVar11 = puVar6[iVar21];
            if (bVar11 == 3) {
              uVar22 = puVar8[iVar21];
              iVar23 = uVar22 + iVar21;
              iVar16 = iVar21 + 1;
              for (iVar10 = iVar16; iVar10 < iVar23; iVar10 = iVar10 + uVar20) {
                bVar11 = puVar6[iVar10];
                if (bVar11 == 6) {
                  iVar17 = iVar16;
                  if (puVar8[iVar10] != 3) goto LAB_00381627;
                  break;
                }
                if (bVar11 == 0) goto LAB_003829f4;
                uVar20 = 1;
                if (bVar11 < 4) {
                  uVar20 = puVar8[iVar10];
                }
              }
              goto LAB_0038165e;
            }
            if (bVar11 != 0) goto LAB_003815b6;
            goto LAB_003829f4;
          }
LAB_00381783:
          free(local_60);
          fputc(10,pFVar9);
          puVar8 = p_00->pBody;
          if (Obj < (int)(puVar8[iVar13] + iVar13)) {
            puVar6 = p_00->pHead;
LAB_003817b5:
            if (puVar6[Obj] != '\x03') {
              if (puVar6[Obj] != '\0') goto LAB_0038283f;
              goto LAB_003829f4;
            }
            iVar10 = puVar8[Obj] + Obj;
            iVar23 = Obj + 1;
            for (iVar21 = iVar23; iVar21 < iVar10; iVar21 = iVar21 + uVar12) {
              bVar11 = puVar6[iVar21];
              if (bVar11 == 6) {
                iVar16 = iVar23;
                if (puVar8[iVar21] != 3) goto LAB_0038182b;
                break;
              }
              if (bVar11 == 0) goto LAB_003829f4;
              uVar12 = 1;
              if (bVar11 < 4) {
                uVar12 = puVar8[iVar21];
              }
            }
            goto LAB_0038283f;
          }
LAB_003828a5:
          fwrite("\nendmodule\n\n",0xc,1,pFVar9);
          puVar6 = p_00->pHead;
          bVar11 = puVar6[iVar13];
        }
        else if (bVar11 == 0) goto LAB_003829f4;
        if (bVar11 == 0) {
LAB_003829f4:
          __assert_fail("p->pHead[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                        ,0x7e,"int Ndr_DataType(Ndr_Data_t *, int)");
        }
        puVar8 = p_00->pBody;
        uVar12 = 1;
        if (bVar11 < 4) {
          uVar12 = puVar8[iVar13];
        }
        iVar13 = iVar13 + uVar12;
      } while (iVar13 < (int)*puVar8);
    }
  }
  pFVar9 = fopen("test.ndr","wb");
  if (pFVar9 == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n","test.ndr");
    if (p_00 == (Ndr_Data_t *)0x0) goto LAB_00382995;
  }
  else {
    fwrite(p_00->pBody,4,(ulong)*p_00->pBody,pFVar9);
    fwrite(p_00->pHead,1,(ulong)*p_00->pBody,pFVar9);
    fclose(pFVar9);
  }
  free(p_00->pHead);
  free(p_00->pBody);
  free(p_00);
LAB_00382995:
  iVar13 = (p->vTypes).nSize;
  if (iVar13 < 2) {
    if (__ptr_00 == (void *)0x0) {
      return;
    }
  }
  else {
    lVar15 = 1;
    do {
      __ptr = *(void **)((long)__ptr_00 + lVar15 * 8);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)__ptr_00 + lVar15 * 8) = 0;
        iVar13 = (p->vTypes).nSize;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < iVar13);
  }
  free(__ptr_00);
  return;
  while( true ) {
    if (bVar11 == 0) goto LAB_003829f4;
    uVar20 = 1;
    if (bVar11 < 4) {
      uVar20 = puVar8[iVar17];
    }
    iVar17 = iVar17 + uVar20;
    if (iVar23 <= iVar17) break;
LAB_00381627:
    bVar11 = puVar6[iVar17];
    if (bVar11 == 6) {
      if (puVar8[iVar17] != 4) {
        if ((int)uVar12 < 1) goto LAB_003816e4;
        uVar24 = 0;
        goto LAB_0038167d;
      }
      break;
    }
  }
  goto LAB_0038165e;
  while (uVar24 = uVar24 + 1, uVar24 != uVar12) {
LAB_0038167d:
    iVar10 = iVar16;
    do {
      bVar11 = puVar6[iVar10];
      if (bVar11 == 5) {
        uVar20 = puVar8[iVar10];
        goto LAB_003816d5;
      }
      if (bVar11 == 0) goto LAB_003829f4;
      uVar20 = 1;
      if (bVar11 < 4) {
        uVar20 = puVar8[iVar10];
      }
      iVar10 = iVar10 + uVar20;
    } while (iVar10 < iVar23);
    uVar20 = 0xffffffff;
LAB_003816d5:
    if (*(uint *)((long)local_60 + uVar24 * 4) == uVar20) goto LAB_0038165e;
  }
LAB_003816e4:
  fwrite("  wire ",7,1,pFVar9);
  Ndr_ObjWriteRange(p_00,iVar21,(FILE *)pFVar9,1);
  puVar8 = p_00->pBody;
  lVar15 = -1;
  if (iVar16 < (int)(puVar8[iVar21] + iVar21)) {
    do {
      bVar11 = p_00->pHead[iVar16];
      if (bVar11 == 5) {
        lVar15 = (long)(int)puVar8[iVar16];
        break;
      }
      if (bVar11 == 0) goto LAB_003829f4;
      uVar22 = 1;
      if (bVar11 < 4) {
        uVar22 = puVar8[iVar16];
      }
      iVar16 = iVar16 + uVar22;
    } while (iVar16 < (int)(puVar8[iVar21] + iVar21));
  }
  fprintf(pFVar9," %s;\n",*(undefined8 *)((long)__ptr_00 + lVar15 * 8));
  puVar6 = p_00->pHead;
  bVar11 = puVar6[iVar21];
LAB_003815b6:
  if (bVar11 == 0) goto LAB_003829f4;
  puVar8 = p_00->pBody;
  uVar22 = 1;
  if (bVar11 < 4) {
    uVar22 = puVar8[iVar21];
  }
LAB_0038165e:
  iVar21 = iVar21 + uVar22;
  if ((int)(puVar8[iVar13] + iVar13) <= iVar21) goto LAB_00381783;
  goto LAB_003815a2;
  while( true ) {
    if (bVar11 == 0) goto LAB_003829f4;
    uVar12 = 1;
    if (bVar11 < 4) {
      uVar12 = puVar8[iVar16];
    }
    iVar16 = iVar16 + uVar12;
    if (iVar10 <= iVar16) break;
LAB_0038182b:
    bVar11 = puVar6[iVar16];
    if (bVar11 == 6) {
      iVar21 = iVar23;
      if (puVar8[iVar16] != 4) goto LAB_0038186b;
      break;
    }
  }
  goto LAB_0038283f;
  while( true ) {
    if (bVar11 == 0) goto LAB_003829f4;
    uVar12 = 1;
    if (bVar11 < 4) {
      uVar12 = puVar8[iVar21];
    }
    iVar21 = iVar21 + uVar12;
    if (iVar10 <= iVar21) break;
LAB_0038186b:
    bVar11 = puVar6[iVar21];
    if (bVar11 == 6) {
      uVar12 = puVar8[iVar21];
      if (0xff < (int)uVar12) {
        iVar21 = uVar12 - 0xff;
        lVar15 = -1;
        goto LAB_0038190b;
      }
      switch(uVar12) {
      case 0x50:
        fprintf(pFVar9,"  %s ","ABC_READ");
        puVar8 = p_00->pBody;
        iVar21 = puVar8[Obj] + Obj;
        if (iVar21 <= iVar23) goto LAB_003823c9;
        iVar10 = iVar23;
        goto LAB_00381ac6;
      case 0x51:
        fprintf(pFVar9,"  %s ","ABC_WRITE");
        puVar8 = p_00->pBody;
        iVar21 = puVar8[Obj] + Obj;
        if (iVar21 <= iVar23) goto LAB_003824f7;
        iVar10 = iVar23;
        goto LAB_00381c53;
      default:
        goto switchD_00381a93_caseD_52;
      case 0x58:
        fprintf(pFVar9,"  %s ","ABC_DFF");
        puVar8 = p_00->pBody;
        iVar21 = puVar8[Obj] + Obj;
        if (iVar21 <= iVar23) goto LAB_003822a5;
        iVar10 = iVar23;
        goto LAB_00381beb;
      case 0x59:
        fprintf(pFVar9,"  %s ","ABC_DFFRSE");
        puVar8 = p_00->pBody;
        iVar21 = puVar8[Obj] + Obj;
        if (iVar21 <= iVar23) goto LAB_0038264b;
        iVar10 = iVar23;
      }
      goto LAB_00381cbb;
    }
  }
  uVar12 = 0xffffffff;
switchD_00381a93_caseD_52:
  iVar21 = iVar23;
  do {
    bVar11 = puVar6[iVar21];
    if (bVar11 == 5) {
      lVar15 = (long)(int)puVar8[iVar21];
      goto LAB_00381948;
    }
    if (bVar11 == 0) goto LAB_003829f4;
    uVar22 = 1;
    if (bVar11 < 4) {
      uVar22 = puVar8[iVar21];
    }
    iVar21 = iVar21 + uVar22;
  } while (iVar21 < iVar10);
  lVar15 = -1;
LAB_00381948:
  fprintf(pFVar9,"  assign %s = ",*(undefined8 *)((long)__ptr_00 + lVar15 * 8));
  puVar8 = p_00->pBody;
  iVar21 = puVar8[Obj] + Obj;
  if (iVar21 <= iVar23) {
LAB_00381a60:
    puVar8 = (uint *)0x0;
LAB_00381a62:
    pcVar3 = "%s;\n";
LAB_00381a6c:
    fprintf(pFVar9,pcVar3,puVar8);
    goto LAB_0038283f;
  }
  puVar6 = p_00->pHead;
  puVar18 = (uint *)0x0;
  puVar7 = (uint *)0x0;
  local_70 = (uint *)0x0;
  iVar10 = iVar23;
  do {
    bVar11 = puVar6[iVar10];
    if (bVar11 == 4) {
      local_70 = (uint *)(ulong)((int)local_70 + 1);
      uVar22 = 1;
      puVar7 = puVar18;
      if (puVar18 == (uint *)0x0) {
        puVar7 = puVar8 + iVar10;
        puVar18 = puVar7;
      }
    }
    else {
      if (bVar11 == 0) goto LAB_003829f4;
      if (puVar7 != (uint *)0x0) break;
      if (bVar11 < 4) {
        uVar22 = puVar8[iVar10];
      }
      else {
        uVar22 = 1;
      }
      puVar7 = (uint *)0x0;
    }
    iVar10 = iVar10 + uVar22;
  } while (iVar10 < iVar21);
  iVar10 = (int)local_70;
  if (iVar10 == 0) {
    do {
      bVar11 = puVar6[iVar23];
      if (bVar11 == 9) {
        puVar8 = puVar8 + iVar23;
        goto LAB_00381a62;
      }
      if (bVar11 == 0) goto LAB_003829f4;
      uVar12 = 1;
      if (bVar11 < 4) {
        uVar12 = puVar8[iVar23];
      }
      iVar23 = iVar23 + uVar12;
    } while (iVar23 < iVar21);
    goto LAB_00381a60;
  }
  iVar16 = iVar23;
  if (iVar10 == 1) {
    do {
      bVar11 = puVar6[iVar16];
      if (bVar11 == 6) {
        if (puVar8[iVar16] == 0xb) {
          puVar8 = *(uint **)((long)__ptr_00 + (long)(int)*puVar18 * 8);
          goto LAB_00381a62;
        }
        break;
      }
      if (bVar11 == 0) goto LAB_003829f4;
      uVar22 = 1;
      if (bVar11 < 4) {
        uVar22 = puVar8[iVar16];
      }
      iVar16 = iVar16 + uVar22;
    } while (iVar16 < iVar21);
  }
  if (uVar12 == 0x5c) {
    fputc(0x7b,pFVar9);
    if (0 < iVar10) {
      uVar24 = 0;
      do {
        pcVar3 = "    \"%s\", ";
        if (iVar10 - 1 == uVar24) {
          pcVar3 = "T = %d\t\t";
        }
        fprintf(pFVar9,"%s%s",*(undefined8 *)((long)__ptr_00 + (long)(int)puVar18[uVar24] * 8),
                pcVar3 + 8);
        uVar24 = uVar24 + 1;
      } while (local_70 != (uint *)uVar24);
    }
    fwrite("};\n",3,1,pFVar9);
    goto LAB_0038283f;
  }
  if (uVar12 != 0x5b) {
    if (iVar10 == 1) {
      do {
        bVar11 = puVar6[iVar23];
        if (bVar11 == 6) {
          uVar12 = puVar8[iVar23];
          goto LAB_003821aa;
        }
        if (bVar11 == 0) goto LAB_003829f4;
        uVar12 = 1;
        if (bVar11 < 4) {
          uVar12 = puVar8[iVar23];
        }
        iVar23 = iVar23 + uVar12;
      } while (iVar23 < iVar21);
      uVar12 = 0xffffffff;
LAB_003821aa:
      pcVar3 = Abc_OperName(uVar12);
      fprintf(pFVar9,"%s %s;\n",pcVar3,*(undefined8 *)((long)__ptr_00 + (long)(int)*puVar18 * 8));
      goto LAB_0038283f;
    }
    if (iVar10 == 2) {
      uVar14 = *(undefined8 *)((long)__ptr_00 + (long)(int)*puVar18 * 8);
      do {
        bVar11 = puVar6[iVar23];
        if (bVar11 == 6) {
          uVar12 = puVar8[iVar23];
          goto LAB_00382228;
        }
        if (bVar11 == 0) goto LAB_003829f4;
        uVar12 = 1;
        if (bVar11 < 4) {
          uVar12 = puVar8[iVar23];
        }
        iVar23 = iVar23 + uVar12;
      } while (iVar23 < iVar21);
      uVar12 = 0xffffffff;
LAB_00382228:
      pcVar3 = Abc_OperName(uVar12);
      uVar19 = *(undefined8 *)((long)__ptr_00 + (long)(int)puVar18[1] * 8);
      pcVar5 = "%s %s %s;\n";
LAB_0038227c:
      fprintf(pFVar9,pcVar5,uVar14,pcVar3,uVar19);
      goto LAB_0038283f;
    }
    if (uVar12 == 0x32 && iVar10 == 3) {
      uVar14 = *(undefined8 *)((long)__ptr_00 + (long)(int)*puVar18 * 8);
      pcVar3 = *(char **)((long)__ptr_00 + (long)(int)puVar18[1] * 8);
      uVar19 = *(undefined8 *)((long)__ptr_00 + (long)(int)puVar18[2] * 8);
      pcVar5 = "%s + %s + %s;\n";
      goto LAB_0038227c;
    }
    if (uVar12 == 0x15) {
      uVar14 = *(undefined8 *)((long)__ptr_00 + (long)(int)*puVar18 * 8);
      pcVar3 = *(char **)((long)__ptr_00 + (long)(int)puVar18[1] * 8);
      uVar19 = *(undefined8 *)((long)__ptr_00 + (long)(int)puVar18[2] * 8);
      pcVar5 = "%s ? %s : %s;\n";
      goto LAB_0038227c;
    }
    iVar21 = Ndr_ObjReadBody(p_00,Obj,6);
    puVar8 = (uint *)Abc_OperName(iVar21);
    pcVar3 = "<cannot write operation %s>;\n";
    goto LAB_00381a6c;
  }
  fputs(*(char **)((long)__ptr_00 + (long)(int)*puVar18 * 8),pFVar9);
  puVar8 = p_00->pBody;
  if (iVar23 < (int)(puVar8[Obj] + Obj)) {
    puVar7 = (uint *)0x0;
    puVar18 = (uint *)0x0;
    iVar21 = 0;
    do {
      bVar11 = p_00->pHead[iVar23];
      if (bVar11 == 8) {
        iVar21 = iVar21 + 1;
        uVar12 = 1;
        puVar18 = puVar7;
        if (puVar7 == (uint *)0x0) {
          puVar7 = puVar8 + iVar23;
          puVar18 = puVar7;
        }
      }
      else {
        if (bVar11 == 0) goto LAB_003829f4;
        if (puVar18 != (uint *)0x0) break;
        if (bVar11 < 4) {
          uVar12 = puVar8[iVar23];
        }
        else {
          uVar12 = 1;
        }
        puVar18 = (uint *)0x0;
      }
      iVar23 = iVar23 + uVar12;
    } while (iVar23 < (int)(puVar8[Obj] + Obj));
    if (iVar21 == 0) goto LAB_00381eba;
    if (iVar21 == 1) {
      uVar12 = *puVar7;
      goto LAB_00381ec6;
    }
    fprintf(pFVar9,"[%d:%d]",(ulong)*puVar7,(ulong)puVar7[1]);
  }
  else {
LAB_00381eba:
    uVar12 = 0;
LAB_00381ec6:
    fprintf(pFVar9,"[%d]",(ulong)uVar12);
  }
  sVar4 = 2;
  pcVar3 = ";\n";
  goto LAB_00382837;
LAB_0038190b:
  if ((int)((uVar12 - 0x100) + puVar8[uVar12 - 0x100]) <= iVar21) goto LAB_00381b01;
  bVar11 = puVar6[iVar21];
  if (bVar11 == 7) {
    lVar15 = (long)(int)puVar8[iVar21];
    goto LAB_00381b01;
  }
  if (bVar11 == 0) goto LAB_003829f4;
  uVar22 = 1;
  if (bVar11 < 4) {
    uVar22 = puVar8[iVar21];
  }
  iVar21 = iVar21 + uVar22;
  goto LAB_0038190b;
LAB_00381b01:
  fprintf(pFVar9,"  %s ",*(undefined8 *)((long)__ptr_00 + lVar15 * 8));
  puVar8 = p_00->pBody;
  iVar21 = puVar8[Obj] + Obj;
  if (iVar23 < iVar21) {
    iVar10 = iVar23;
    do {
      bVar11 = p_00->pHead[iVar10];
      if (bVar11 == 7) {
        iVar16 = iVar23;
        if (0 < (int)puVar8[iVar10]) goto LAB_00381b73;
        break;
      }
      if (bVar11 == 0) goto LAB_003829f4;
      uVar12 = 1;
      if (bVar11 < 4) {
        uVar12 = puVar8[iVar10];
      }
      iVar10 = iVar10 + uVar12;
    } while (iVar10 < iVar21);
  }
  goto LAB_00381f56;
  while( true ) {
    if (bVar11 == 0) goto LAB_003829f4;
    uVar12 = 1;
    if (bVar11 < 4) {
      uVar12 = puVar8[iVar16];
    }
    iVar16 = iVar16 + uVar12;
    if (iVar21 <= iVar16) break;
LAB_00381b73:
    bVar11 = p_00->pHead[iVar16];
    if (bVar11 == 7) {
      lVar15 = (long)(int)puVar8[iVar16];
      goto LAB_00381f3d;
    }
  }
  lVar15 = -1;
LAB_00381f3d:
  fprintf(pFVar9,"%s ",*(undefined8 *)((long)__ptr_00 + lVar15 * 8));
LAB_00381f56:
  fwrite("( ",2,1,pFVar9);
  puVar8 = p_00->pBody;
  if (iVar23 < (int)(puVar8[Obj] + Obj)) {
    puVar18 = (uint *)0x0;
    puVar7 = (uint *)0x0;
    uVar12 = 0;
    do {
      bVar11 = p_00->pHead[iVar23];
      if (bVar11 == 4) {
        uVar12 = uVar12 + 1;
        uVar22 = 1;
        puVar7 = puVar18;
        if (puVar18 == (uint *)0x0) {
          puVar7 = puVar8 + iVar23;
          puVar18 = puVar7;
        }
      }
      else {
        if (bVar11 == 0) goto LAB_003829f4;
        if (puVar7 != (uint *)0x0) break;
        if (bVar11 < 4) {
          uVar22 = puVar8[iVar23];
        }
        else {
          uVar22 = 1;
        }
        puVar7 = (uint *)0x0;
      }
      iVar23 = iVar23 + uVar22;
    } while (iVar23 < (int)(puVar8[Obj] + Obj));
    if (0 < (int)uVar12) {
      uVar24 = 0;
      do {
        pcVar3 = ",";
        if (uVar12 - 1 == uVar24) {
          pcVar3 = "";
        }
        fprintf(pFVar9,"%s%s ",*(undefined8 *)((long)__ptr_00 + (long)(int)puVar18[uVar24] * 8),
                pcVar3);
        uVar24 = uVar24 + 1;
      } while (uVar12 != uVar24);
    }
  }
  fwrite(");\n",3,1,pFVar9);
  goto LAB_0038283f;
  while( true ) {
    if (bVar11 == 0) goto LAB_003829f4;
    uVar12 = 1;
    if (bVar11 < 4) {
      uVar12 = puVar8[iVar10];
    }
    iVar10 = iVar10 + uVar12;
    if (iVar21 <= iVar10) break;
LAB_00381cbb:
    bVar11 = p_00->pHead[iVar10];
    if (bVar11 == 7) {
      iVar16 = iVar23;
      if (0 < (int)puVar8[iVar10]) goto LAB_00382166;
      break;
    }
  }
  goto LAB_0038264b;
  while( true ) {
    if (bVar11 == 0) goto LAB_003829f4;
    uVar12 = 1;
    if (bVar11 < 4) {
      uVar12 = puVar8[iVar16];
    }
    iVar16 = iVar16 + uVar12;
    if (iVar21 <= iVar16) break;
LAB_00382166:
    bVar11 = p_00->pHead[iVar16];
    if (bVar11 == 7) {
      lVar15 = (long)(int)puVar8[iVar16];
      goto LAB_00382632;
    }
  }
  lVar15 = -1;
LAB_00382632:
  fprintf(pFVar9,"%s ",*(undefined8 *)((long)__ptr_00 + lVar15 * 8));
LAB_0038264b:
  fwrite("( ",2,1,pFVar9);
  puVar8 = p_00->pBody;
  iVar21 = puVar8[Obj] + Obj;
  lVar15 = -1;
  if (iVar23 < iVar21) {
    puVar7 = (uint *)0x0;
    puVar18 = (uint *)0x0;
    iVar10 = iVar23;
    do {
      bVar11 = p_00->pHead[iVar10];
      if (bVar11 == 4) {
        uVar12 = 1;
        puVar18 = puVar7;
        if (puVar7 == (uint *)0x0) {
          puVar18 = puVar8 + iVar10;
          puVar7 = puVar18;
        }
      }
      else {
        if (bVar11 == 0) goto LAB_003829f4;
        if (puVar18 != (uint *)0x0) break;
        if (bVar11 < 4) {
          uVar12 = puVar8[iVar10];
        }
        else {
          uVar12 = 1;
        }
        puVar18 = (uint *)0x0;
      }
      iVar10 = iVar10 + uVar12;
    } while (iVar10 < iVar21);
    do {
      bVar11 = p_00->pHead[iVar23];
      if (bVar11 == 5) {
        lVar15 = (long)(int)puVar8[iVar23];
        break;
      }
      if (bVar11 == 0) goto LAB_003829f4;
      uVar12 = 1;
      if (bVar11 < 4) {
        uVar12 = puVar8[iVar23];
      }
      iVar23 = iVar23 + uVar12;
    } while (iVar23 < iVar21);
  }
  else {
    puVar7 = (uint *)0x0;
  }
  fprintf(pFVar9,".q(%s), ",*(undefined8 *)((long)__ptr_00 + lVar15 * 8));
  fprintf(pFVar9,".d(%s), ",*(undefined8 *)((long)__ptr_00 + (long)(int)*puVar7 * 8));
  fprintf(pFVar9,".clk(%s), ",*(undefined8 *)((long)__ptr_00 + (long)(int)puVar7[1] * 8));
  fprintf(pFVar9,".reset(%s), ",*(undefined8 *)((long)__ptr_00 + (long)(int)puVar7[2] * 8));
  fprintf(pFVar9,".set(%s), ",*(undefined8 *)((long)__ptr_00 + (long)(int)puVar7[3] * 8));
  fprintf(pFVar9,".enable(%s), ",*(undefined8 *)((long)__ptr_00 + (long)(int)puVar7[4] * 8));
  fprintf(pFVar9,".async(%s), ",*(undefined8 *)((long)__ptr_00 + (long)(int)puVar7[5] * 8));
  fprintf(pFVar9,".sre(%s), ",*(undefined8 *)((long)__ptr_00 + (long)(int)puVar7[6] * 8));
  uVar14 = *(undefined8 *)((long)__ptr_00 + (long)(int)puVar7[7] * 8);
  goto LAB_00382815;
  while( true ) {
    if (bVar11 == 0) goto LAB_003829f4;
    uVar12 = 1;
    if (bVar11 < 4) {
      uVar12 = puVar8[iVar10];
    }
    iVar10 = iVar10 + uVar12;
    if (iVar21 <= iVar10) break;
LAB_00381beb:
    bVar11 = p_00->pHead[iVar10];
    if (bVar11 == 7) {
      iVar16 = iVar23;
      if (0 < (int)puVar8[iVar10]) goto LAB_00382085;
      break;
    }
  }
  goto LAB_003822a5;
  while( true ) {
    if (bVar11 == 0) goto LAB_003829f4;
    uVar12 = 1;
    if (bVar11 < 4) {
      uVar12 = puVar8[iVar16];
    }
    iVar16 = iVar16 + uVar12;
    if (iVar21 <= iVar16) break;
LAB_00382085:
    bVar11 = p_00->pHead[iVar16];
    if (bVar11 == 7) {
      lVar15 = (long)(int)puVar8[iVar16];
      goto LAB_0038228c;
    }
  }
  lVar15 = -1;
LAB_0038228c:
  fprintf(pFVar9,"%s ",*(undefined8 *)((long)__ptr_00 + lVar15 * 8));
LAB_003822a5:
  fwrite("( ",2,1,pFVar9);
  puVar8 = p_00->pBody;
  iVar21 = puVar8[Obj] + Obj;
  lVar15 = -1;
  if (iVar23 < iVar21) {
    puVar7 = (uint *)0x0;
    puVar18 = (uint *)0x0;
    iVar10 = iVar23;
    do {
      bVar11 = p_00->pHead[iVar10];
      if (bVar11 == 4) {
        uVar12 = 1;
        puVar18 = puVar7;
        if (puVar7 == (uint *)0x0) {
          puVar18 = puVar8 + iVar10;
          puVar7 = puVar18;
        }
      }
      else {
        if (bVar11 == 0) goto LAB_003829f4;
        if (puVar18 != (uint *)0x0) break;
        if (bVar11 < 4) {
          uVar12 = puVar8[iVar10];
        }
        else {
          uVar12 = 1;
        }
        puVar18 = (uint *)0x0;
      }
      iVar10 = iVar10 + uVar12;
    } while (iVar10 < iVar21);
    do {
      bVar11 = p_00->pHead[iVar23];
      if (bVar11 == 5) {
        lVar15 = (long)(int)puVar8[iVar23];
        break;
      }
      if (bVar11 == 0) goto LAB_003829f4;
      uVar12 = 1;
      if (bVar11 < 4) {
        uVar12 = puVar8[iVar23];
      }
      iVar23 = iVar23 + uVar12;
    } while (iVar23 < iVar21);
  }
  else {
    puVar7 = (uint *)0x0;
  }
  fprintf(pFVar9,".q(%s), ",*(undefined8 *)((long)__ptr_00 + lVar15 * 8));
  fprintf(pFVar9,".d(%s), ",*(undefined8 *)((long)__ptr_00 + (long)(int)*puVar7 * 8));
  uVar14 = *(undefined8 *)((long)__ptr_00 + (long)(int)puVar7[1] * 8);
LAB_00382815:
  pcVar3 = ".init(%s) ";
  goto LAB_0038281f;
  while( true ) {
    if (bVar11 == 0) goto LAB_003829f4;
    uVar12 = 1;
    if (bVar11 < 4) {
      uVar12 = puVar8[iVar10];
    }
    iVar10 = iVar10 + uVar12;
    if (iVar21 <= iVar10) break;
LAB_00381c53:
    bVar11 = p_00->pHead[iVar10];
    if (bVar11 == 7) {
      iVar16 = iVar23;
      if (0 < (int)puVar8[iVar10]) goto LAB_0038211b;
      break;
    }
  }
  goto LAB_003824f7;
  while( true ) {
    if (bVar11 == 0) goto LAB_003829f4;
    uVar12 = 1;
    if (bVar11 < 4) {
      uVar12 = puVar8[iVar16];
    }
    iVar16 = iVar16 + uVar12;
    if (iVar21 <= iVar16) break;
LAB_0038211b:
    bVar11 = p_00->pHead[iVar16];
    if (bVar11 == 7) {
      lVar15 = (long)(int)puVar8[iVar16];
      goto LAB_003824de;
    }
  }
  lVar15 = -1;
LAB_003824de:
  fprintf(pFVar9,"%s ",*(undefined8 *)((long)__ptr_00 + lVar15 * 8));
LAB_003824f7:
  fwrite("( ",2,1,pFVar9);
  puVar8 = p_00->pBody;
  iVar21 = puVar8[Obj] + Obj;
  lVar15 = -1;
  if (iVar23 < iVar21) {
    local_70 = (uint *)0x0;
    puVar7 = (uint *)0x0;
    iVar10 = iVar23;
    do {
      bVar11 = p_00->pHead[iVar10];
      if (bVar11 == 4) {
        uVar12 = 1;
        puVar7 = local_70;
        if (local_70 == (uint *)0x0) {
          puVar7 = puVar8 + iVar10;
          local_70 = puVar7;
        }
      }
      else {
        if (bVar11 == 0) goto LAB_003829f4;
        if (puVar7 != (uint *)0x0) break;
        if (bVar11 < 4) {
          uVar12 = puVar8[iVar10];
        }
        else {
          uVar12 = 1;
        }
        puVar7 = (uint *)0x0;
      }
      iVar10 = iVar10 + uVar12;
    } while (iVar10 < iVar21);
    do {
      bVar11 = p_00->pHead[iVar23];
      if (bVar11 == 5) {
        lVar15 = (long)(int)puVar8[iVar23];
        break;
      }
      if (bVar11 == 0) goto LAB_003829f4;
      uVar12 = 1;
      if (bVar11 < 4) {
        uVar12 = puVar8[iVar23];
      }
      iVar23 = iVar23 + uVar12;
    } while (iVar23 < iVar21);
  }
  else {
    local_70 = (uint *)0x0;
  }
  fprintf(pFVar9,".mem_out(%s), ",*(undefined8 *)((long)__ptr_00 + lVar15 * 8));
  fprintf(pFVar9,".mem_in(%s), ",*(undefined8 *)((long)__ptr_00 + (long)(int)*local_70 * 8));
  fprintf(pFVar9,".addr(%s), ",*(undefined8 *)((long)__ptr_00 + (long)(int)local_70[1] * 8));
  uVar14 = *(undefined8 *)((long)__ptr_00 + (long)(int)local_70[2] * 8);
  pcVar3 = ".data(%s) ";
  goto LAB_0038281f;
  while( true ) {
    if (bVar11 == 0) goto LAB_003829f4;
    uVar12 = 1;
    if (bVar11 < 4) {
      uVar12 = puVar8[iVar10];
    }
    iVar10 = iVar10 + uVar12;
    if (iVar21 <= iVar10) break;
LAB_00381ac6:
    bVar11 = p_00->pHead[iVar10];
    if (bVar11 == 7) {
      iVar16 = iVar23;
      if (0 < (int)puVar8[iVar10]) goto LAB_003820d0;
      break;
    }
  }
  goto LAB_003823c9;
  while( true ) {
    if (bVar11 == 0) goto LAB_003829f4;
    uVar12 = 1;
    if (bVar11 < 4) {
      uVar12 = puVar8[iVar16];
    }
    iVar16 = iVar16 + uVar12;
    if (iVar21 <= iVar16) break;
LAB_003820d0:
    bVar11 = p_00->pHead[iVar16];
    if (bVar11 == 7) {
      lVar15 = (long)(int)puVar8[iVar16];
      goto LAB_003823b0;
    }
  }
  lVar15 = -1;
LAB_003823b0:
  fprintf(pFVar9,"%s ",*(undefined8 *)((long)__ptr_00 + lVar15 * 8));
LAB_003823c9:
  fwrite("( ",2,1,pFVar9);
  puVar8 = p_00->pBody;
  iVar21 = puVar8[Obj] + Obj;
  lVar15 = -1;
  if (iVar23 < iVar21) {
    puVar7 = (uint *)0x0;
    puVar18 = (uint *)0x0;
    iVar10 = iVar23;
    do {
      bVar11 = p_00->pHead[iVar10];
      if (bVar11 == 4) {
        uVar12 = 1;
        puVar18 = puVar7;
        if (puVar7 == (uint *)0x0) {
          puVar18 = puVar8 + iVar10;
          puVar7 = puVar18;
        }
      }
      else {
        if (bVar11 == 0) goto LAB_003829f4;
        if (puVar18 != (uint *)0x0) break;
        if (bVar11 < 4) {
          uVar12 = puVar8[iVar10];
        }
        else {
          uVar12 = 1;
        }
        puVar18 = (uint *)0x0;
      }
      iVar10 = iVar10 + uVar12;
    } while (iVar10 < iVar21);
    do {
      bVar11 = p_00->pHead[iVar23];
      if (bVar11 == 5) {
        lVar15 = (long)(int)puVar8[iVar23];
        break;
      }
      if (bVar11 == 0) goto LAB_003829f4;
      uVar12 = 1;
      if (bVar11 < 4) {
        uVar12 = puVar8[iVar23];
      }
      iVar23 = iVar23 + uVar12;
    } while (iVar23 < iVar21);
  }
  else {
    puVar7 = (uint *)0x0;
  }
  fprintf(pFVar9,".data(%s), ",*(undefined8 *)((long)__ptr_00 + lVar15 * 8));
  fprintf(pFVar9,".mem_in(%s), ",*(undefined8 *)((long)__ptr_00 + (long)(int)*puVar7 * 8));
  uVar14 = *(undefined8 *)((long)__ptr_00 + (long)(int)puVar7[1] * 8);
  pcVar3 = ".addr(%s) ";
LAB_0038281f:
  fprintf(pFVar9,pcVar3,uVar14);
  sVar4 = 3;
  pcVar3 = ");\n";
LAB_00382837:
  fwrite(pcVar3,sVar4,1,pFVar9);
LAB_0038283f:
  puVar6 = p_00->pHead;
  if (puVar6[Obj] == 0) goto LAB_003829f4;
  puVar8 = p_00->pBody;
  uVar12 = 1;
  if (puVar6[Obj] < 4) {
    uVar12 = puVar8[Obj];
  }
  Obj = Obj + uVar12;
  if ((int)(puVar8[iVar13] + iVar13) <= Obj) goto LAB_003828a5;
  goto LAB_003817b5;
}

Assistant:

void Wln_NtkToNdrTest( Wln_Ntk_t * p )
{
    // transform
    void * pDesign = Wln_NtkToNdr( p );

    // collect names     
    char ** ppNames = ABC_ALLOC( char *, Wln_NtkObjNum(p) + 1 ); int i;
    Wln_NtkForEachObj( p, i ) 
        ppNames[i] = Abc_UtilStrsav(Wln_ObjName(p, i));

    // verify by writing Verilog
    Ndr_WriteVerilog( NULL, pDesign, ppNames );
    Ndr_Write( "test.ndr", pDesign );

    // cleanup
    Ndr_Delete( pDesign );
    Wln_NtkForEachObj( p, i ) 
        ABC_FREE( ppNames[i] );
    ABC_FREE( ppNames );
}